

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int fs_read(char *name,void **result,uint *result_len)

{
  IOHANDLE pIVar1;
  undefined4 *in_RDX;
  char *in_RSI;
  uint *in_RDI;
  IOHANDLE file;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pIVar1 = io_open(in_RSI,(int)((ulong)in_RDX >> 0x20));
  in_RSI[0] = '\0';
  in_RSI[1] = '\0';
  in_RSI[2] = '\0';
  in_RSI[3] = '\0';
  in_RSI[4] = '\0';
  in_RSI[5] = '\0';
  in_RSI[6] = '\0';
  in_RSI[7] = '\0';
  *in_RDX = 0;
  if (pIVar1 != (IOHANDLE)0x0) {
    io_read_all(file,(void **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
    io_close((IOHANDLE)0x25739e);
  }
  return (uint)(pIVar1 == (IOHANDLE)0x0);
}

Assistant:

int fs_read(const char *name, void **result, unsigned *result_len)
{
	IOHANDLE file = io_open(name, IOFLAG_READ);
	*result = 0;
	*result_len = 0;
	if(!file)
	{
		return 1;
	}
	io_read_all(file, result, result_len);
	io_close(file);
	return 0;
}